

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::scrollContentsBy(QColumnView *this,int dx,int dy)

{
  bool bVar1;
  QColumnViewPrivate *pQVar2;
  long lVar3;
  qsizetype qVar4;
  const_reference ppQVar5;
  int in_ESI;
  int i;
  QColumnViewPrivate *d;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QAbstractItemView *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  int local_1c;
  
  pQVar2 = d_func((QColumnView *)0x863784);
  bVar1 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x86379a);
  if ((!bVar1) && (in_ESI != 0)) {
    bVar1 = QWidget::isRightToLeft((QWidget *)0x8637b4);
    if (bVar1) {
      in_ESI = -in_ESI;
    }
    local_1c = 0;
    iVar6 = in_ESI;
    while( true ) {
      lVar3 = (long)local_1c;
      qVar4 = QList<QAbstractItemView_*>::size(&pQVar2->columns);
      if (qVar4 <= lVar3) break;
      ppQVar5 = QList<QAbstractItemView_*>::at
                          ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffc0,
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffc0 = *ppQVar5;
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffc0,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      QWidget::x((QWidget *)CONCAT44(iVar6,in_stack_ffffffffffffffd0));
      QWidget::move((QWidget *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),(int)((ulong)lVar3 >> 0x20)
                    ,(int)lVar3);
      local_1c = local_1c + 1;
    }
    pQVar2->offset = in_ESI + pQVar2->offset;
    QAbstractScrollArea::scrollContentsBy
              (&in_stack_ffffffffffffffc0->super_QAbstractScrollArea,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void QColumnView::scrollContentsBy(int dx, int dy)
{
    Q_D(QColumnView);
    if (d->columns.isEmpty() || dx == 0)
        return;

    dx = isRightToLeft() ? -dx : dx;
    for (int i = 0; i < d->columns.size(); ++i)
        d->columns.at(i)->move(d->columns.at(i)->x() + dx, 0);
    d->offset += dx;
    QAbstractItemView::scrollContentsBy(dx, dy);
}